

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O1

bool QStyleHelper::hasAncestor(QObject *obj,Role role)

{
  bool bVar1;
  Role RVar2;
  long *plVar3;
  bool bVar4;
  bool bVar5;
  QObject *pQVar6;
  
  if (obj == (QObject *)0x0) {
    pQVar6 = (QObject *)0x0;
  }
  else {
    pQVar6 = *(QObject **)(*(long *)(obj + 8) + 0x10);
  }
  bVar4 = false;
  bVar5 = false;
  if (pQVar6 != (QObject *)0x0) {
    do {
      plVar3 = (long *)QAccessible::queryAccessibleInterface(pQVar6);
      bVar1 = bVar4;
      if (plVar3 != (long *)0x0) {
        RVar2 = (**(code **)(*plVar3 + 0x78))(plVar3);
        bVar5 = true;
        bVar1 = true;
        if (RVar2 != role) {
          bVar5 = bVar4;
          bVar1 = bVar4;
        }
      }
      bVar4 = bVar1;
      pQVar6 = *(QObject **)(*(long *)(pQVar6 + 8) + 0x10);
    } while ((pQVar6 != (QObject *)0x0) && (!bVar5));
  }
  return bVar5;
}

Assistant:

bool hasAncestor(QObject *obj, QAccessible::Role role)
{
    bool found = false;
    QObject *parent = obj ? obj->parent() : nullptr;
    while (parent && !found) {
        if (isInstanceOf(parent, role))
            found = true;
        parent = parent->parent();
    }
    return found;
}